

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine_unix.cpp
# Opt level: O3

qint64 __thiscall QFSFileEnginePrivate::nativeRead(QFSFileEnginePrivate *this,char *data,qint64 len)

{
  QFSFileEnginePrivate *this_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  int *piVar6;
  qint64 qVar7;
  
  if (this->fh != (FILE *)0x0) {
    this_00 = (QFSFileEnginePrivate *)(this->super_QAbstractFileEnginePrivate).q_ptr;
    bVar1 = isSequentialFdFh(this);
    if (bVar1) {
      iVar3 = fileno((FILE *)this->fh);
      uVar4 = fcntl(iVar3,3);
      qVar7 = 0;
      bVar1 = true;
      do {
        bVar2 = bVar1;
        if ((uVar4 >> 0xb & 1) == 0) {
          iVar3 = fileno((FILE *)this->fh);
          fcntl(iVar3,4,(ulong)(uVar4 | 0x800));
        }
        do {
          sVar5 = fread(data + qVar7,1,len - qVar7,(FILE *)this->fh);
          if (sVar5 != 0) {
            qVar7 = qVar7 + sVar5;
            goto LAB_00131ff9;
          }
          iVar3 = feof((FILE *)this->fh);
        } while ((iVar3 == 0) && (piVar6 = __errno_location(), *piVar6 == 4));
        if (qVar7 == 0 && (uVar4 >> 0xb & 1) == 0) {
          iVar3 = fileno((FILE *)this->fh);
          fcntl(iVar3,4,(ulong)uVar4);
          while (iVar3 = fgetc((FILE *)this->fh), iVar3 == -1) {
            piVar6 = __errno_location();
            if (*piVar6 != 4) {
              qVar7 = 0;
              goto LAB_00131ff9;
            }
          }
          *data = (char)iVar3;
          qVar7 = 1;
        }
        else {
          if (qVar7 != 0) break;
          qVar7 = 0;
        }
        bVar1 = false;
      } while (bVar2);
LAB_00131ff9:
      if ((uVar4 >> 0xb & 1) == 0) {
        iVar3 = fileno((FILE *)this->fh);
        fcntl(iVar3,4,(ulong)uVar4);
      }
      if (qVar7 == 0) {
        iVar3 = feof((FILE *)this->fh);
        if (iVar3 == 0) {
          nativeRead(this_00);
          qVar7 = -1;
        }
        else {
          qVar7 = 0;
        }
      }
      return qVar7;
    }
  }
  qVar7 = readFdFh(this,data,len);
  return qVar7;
}

Assistant:

qint64 QFSFileEnginePrivate::nativeRead(char *data, qint64 len)
{
    Q_Q(QFSFileEngine);

    if (fh && nativeIsSequential()) {
        size_t readBytes = 0;
        int oldFlags = fcntl(QT_FILENO(fh), F_GETFL);
        for (int i = 0; i < 2; ++i) {
            // Unix: Make the underlying file descriptor non-blocking
            if ((oldFlags & O_NONBLOCK) == 0)
                fcntl(QT_FILENO(fh), F_SETFL, oldFlags | O_NONBLOCK);

            // Cross platform stdlib read
            size_t read = 0;
            do {
                read = fread(data + readBytes, 1, size_t(len - readBytes), fh);
            } while (read == 0 && !feof(fh) && errno == EINTR);
            if (read > 0) {
                readBytes += read;
                break;
            } else {
                if (readBytes)
                    break;
                readBytes = read;
            }

            // Unix: Restore the blocking state of the underlying socket
            if ((oldFlags & O_NONBLOCK) == 0) {
                fcntl(QT_FILENO(fh), F_SETFL, oldFlags);
                if (readBytes == 0) {
                    int readByte = 0;
                    do {
                        readByte = fgetc(fh);
                    } while (readByte == -1 && errno == EINTR);
                    if (readByte != -1) {
                        *data = uchar(readByte);
                        readBytes += 1;
                    } else {
                        break;
                    }
                }
            }
        }
        // Unix: Restore the blocking state of the underlying socket
        if ((oldFlags & O_NONBLOCK) == 0) {
            fcntl(QT_FILENO(fh), F_SETFL, oldFlags);
        }
        if (readBytes == 0 && !feof(fh)) {
            // if we didn't read anything and we're not at EOF, it must be an error
            q->setError(QFile::ReadError, qt_error_string(errno));
            return -1;
        }
        return readBytes;
    }

    return readFdFh(data, len);
}